

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::MessageGenerator::Generate
          (MessageGenerator *this,Printer *printer)

{
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::FieldGenerator>_>
  *psVar1;
  string *psVar2;
  int iVar3;
  size_t sVar4;
  FieldGenerator *pFVar5;
  Descriptor *pDVar6;
  int i;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  Descriptor *extraout_RDX_01;
  Descriptor *extraout_RDX_02;
  char *pcVar7;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 uVar8;
  FieldDescriptor *field;
  int iVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  char *pcVar14;
  SubstituteArg *in_stack_fffffffffffffd78;
  MessageGenerator messageGenerator;
  string local_248;
  string builder_type;
  string local_200;
  undefined1 local_1e0 [48];
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  pDVar6 = this->descriptor_;
  if (*(long *)(pDVar6 + 0x18) == 0) {
    pcVar14 = "static";
    if (*(char *)(*(long *)(*(long *)(pDVar6 + 0x10) + 0x88) + 0x54) != '\0') {
      pcVar14 = "";
    }
  }
  else {
    pcVar14 = "static";
  }
  WriteMessageDocComment(printer,pDVar6);
  builder_type._M_dataplus._M_p = (pointer)&builder_type.field_2;
  builder_type._M_string_length = 0;
  builder_type.field_2._M_local_buf[0] = '\0';
  iVar9 = *(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50);
  psVar1 = &messageGenerator.field_generators_.field_generators_;
  messageGenerator.descriptor_ = (Descriptor *)psVar1;
  if (*(int *)(this->descriptor_ + 0x58) < 1) {
    if (iVar9 == 3) {
      sVar4 = strlen(pcVar14);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&messageGenerator,pcVar14,pcVar14 + sVar4);
      io::Printer::Print(printer,
                         "public $static$ final class $classname$ extends\n    com.google.protobuf.GeneratedMessageLite\n    implements $classname$OrBuilder {\n"
                         ,"static",(string *)&messageGenerator,"classname",
                         *(string **)this->descriptor_);
      if (messageGenerator.descriptor_ != (Descriptor *)psVar1) {
        operator_delete(messageGenerator.descriptor_,
                        (ulong)((long)&(messageGenerator.field_generators_.field_generators_.array_)
                                       ->ptr_ + 1));
      }
      pcVar14 = "com.google.protobuf.GeneratedMessageLite.Builder";
    }
    else {
      sVar4 = strlen(pcVar14);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&messageGenerator,pcVar14,pcVar14 + sVar4);
      io::Printer::Print(printer,
                         "public $static$ final class $classname$ extends\n    com.google.protobuf.GeneratedMessage\n    implements $classname$OrBuilder {\n"
                         ,"static",(string *)&messageGenerator,"classname",
                         *(string **)this->descriptor_);
      if (messageGenerator.descriptor_ != (Descriptor *)psVar1) {
        operator_delete(messageGenerator.descriptor_,
                        (ulong)((long)&(messageGenerator.field_generators_.field_generators_.array_)
                                       ->ptr_ + 1));
      }
      pcVar14 = "com.google.protobuf.GeneratedMessage.Builder<?>";
    }
    std::__cxx11::string::_M_replace
              ((ulong)&builder_type,0,(char *)builder_type._M_string_length,(ulong)pcVar14);
  }
  else {
    if (iVar9 == 3) {
      sVar4 = strlen(pcVar14);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&messageGenerator,pcVar14,pcVar14 + sVar4);
      io::Printer::Print(printer,
                         "public $static$ final class $classname$ extends\n    com.google.protobuf.GeneratedMessageLite.ExtendableMessage<\n      $classname$> implements $classname$OrBuilder {\n"
                         ,"static",(string *)&messageGenerator,"classname",
                         *(string **)this->descriptor_);
      pDVar6 = extraout_RDX;
      if (messageGenerator.descriptor_ != (Descriptor *)psVar1) {
        operator_delete(messageGenerator.descriptor_,
                        (ulong)((long)&(messageGenerator.field_generators_.field_generators_.array_)
                                       ->ptr_ + 1));
        pDVar6 = extraout_RDX_00;
      }
      ClassName_abi_cxx11_(&local_248,(java *)this->descriptor_,pDVar6);
      messageGenerator.descriptor_ = (Descriptor *)local_248._M_dataplus._M_p;
      messageGenerator.field_generators_.descriptor_._0_4_ = (undefined4)local_248._M_string_length;
      local_1e0._0_8_ = (char *)0x0;
      local_1e0._8_4_ = -1;
      local_60.text_ = (char *)0x0;
      local_60.size_ = -1;
      local_90.text_ = (char *)0x0;
      local_90.size_ = -1;
      local_c0.text_ = (char *)0x0;
      local_c0.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      local_180.text_ = (char *)0x0;
      local_180.size_ = -1;
      local_1b0.text_ = (char *)0x0;
      local_1b0.size_ = -1;
      strings::Substitute_abi_cxx11_
                (&local_200,
                 (strings *)"com.google.protobuf.GeneratedMessageLite.ExtendableBuilder<$0, ?>",
                 (char *)&messageGenerator,(SubstituteArg *)local_1e0,&local_60,&local_90,&local_c0,
                 &local_f0,&local_120,&local_150,&local_180,&local_1b0,in_stack_fffffffffffffd78);
    }
    else {
      sVar4 = strlen(pcVar14);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&messageGenerator,pcVar14,pcVar14 + sVar4);
      io::Printer::Print(printer,
                         "public $static$ final class $classname$ extends\n    com.google.protobuf.GeneratedMessage.ExtendableMessage<\n      $classname$> implements $classname$OrBuilder {\n"
                         ,"static",(string *)&messageGenerator,"classname",
                         *(string **)this->descriptor_);
      pDVar6 = extraout_RDX_01;
      if (messageGenerator.descriptor_ != (Descriptor *)psVar1) {
        operator_delete(messageGenerator.descriptor_,
                        (ulong)((long)&(messageGenerator.field_generators_.field_generators_.array_)
                                       ->ptr_ + 1));
        pDVar6 = extraout_RDX_02;
      }
      ClassName_abi_cxx11_(&local_248,(java *)this->descriptor_,pDVar6);
      messageGenerator.descriptor_ = (Descriptor *)local_248._M_dataplus._M_p;
      messageGenerator.field_generators_.descriptor_._0_4_ = (undefined4)local_248._M_string_length;
      local_1e0._0_8_ = (char *)0x0;
      local_1e0._8_4_ = -1;
      local_60.text_ = (char *)0x0;
      local_60.size_ = -1;
      local_90.text_ = (char *)0x0;
      local_90.size_ = -1;
      local_c0.text_ = (char *)0x0;
      local_c0.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      local_180.text_ = (char *)0x0;
      local_180.size_ = -1;
      local_1b0.text_ = (char *)0x0;
      local_1b0.size_ = -1;
      strings::Substitute_abi_cxx11_
                (&local_200,
                 (strings *)"com.google.protobuf.GeneratedMessage.ExtendableBuilder<$0, ?>",
                 (char *)&messageGenerator,(SubstituteArg *)local_1e0,&local_60,&local_90,&local_c0,
                 &local_f0,&local_120,&local_150,&local_180,&local_1b0,in_stack_fffffffffffffd78);
    }
    std::__cxx11::string::operator=((string *)&builder_type,(string *)&local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
  }
  io::Printer::Indent(printer);
  psVar2 = *(string **)this->descriptor_;
  iVar9 = *(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50);
  pcVar14 = "  this.unknownFields = builder.getUnknownFields();";
  if (iVar9 == 3) {
    pcVar14 = "";
  }
  messageGenerator.descriptor_ = (Descriptor *)&messageGenerator.field_generators_.field_generators_
  ;
  pcVar7 = pcVar14 + 0x32;
  if (iVar9 == 3) {
    pcVar7 = pcVar14;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&messageGenerator,pcVar14,pcVar7);
  io::Printer::Print(printer,
                     "// Use $classname$.newBuilder() to construct.\nprivate $classname$($buildertype$ builder) {\n  super(builder);\n$set_unknown_fields$\n}\n"
                     ,"classname",psVar2,"buildertype",&builder_type,"set_unknown_fields",
                     (string *)&messageGenerator);
  if (messageGenerator.descriptor_ !=
      (Descriptor *)&messageGenerator.field_generators_.field_generators_) {
    operator_delete(messageGenerator.descriptor_,
                    (ulong)((long)&(messageGenerator.field_generators_.field_generators_.array_)->
                                   ptr_ + 1));
  }
  psVar2 = *(string **)this->descriptor_;
  iVar9 = *(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50);
  pcVar14 = " this.unknownFields = com.google.protobuf.UnknownFieldSet.getDefaultInstance(); ";
  if (iVar9 == 3) {
    pcVar14 = "";
  }
  messageGenerator.descriptor_ = (Descriptor *)&messageGenerator.field_generators_.field_generators_
  ;
  pcVar7 = pcVar14 + 0x50;
  if (iVar9 == 3) {
    pcVar7 = pcVar14;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&messageGenerator,pcVar14,pcVar7);
  io::Printer::Print(printer,
                     "private $classname$(boolean noInit) {$set_default_unknown_fields$}\n\nprivate static final $classname$ defaultInstance;\npublic static $classname$ getDefaultInstance() {\n  return defaultInstance;\n}\n\npublic $classname$ getDefaultInstanceForType() {\n  return defaultInstance;\n}\n\n"
                     ,"classname",psVar2,"set_default_unknown_fields",(string *)&messageGenerator);
  if (messageGenerator.descriptor_ !=
      (Descriptor *)&messageGenerator.field_generators_.field_generators_) {
    operator_delete(messageGenerator.descriptor_,
                    (ulong)((long)&(messageGenerator.field_generators_.field_generators_.array_)->
                                   ptr_ + 1));
  }
  if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) != 3) {
    io::Printer::Print(printer,
                       "private final com.google.protobuf.UnknownFieldSet unknownFields;\n@java.lang.Override\npublic final com.google.protobuf.UnknownFieldSet\n    getUnknownFields() {\n  return this.unknownFields;\n}\n"
                      );
  }
  if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) != 2) {
    GenerateParsingConstructor(this,printer);
  }
  GenerateDescriptorMethods(this,printer);
  GenerateParser(this,printer);
  pDVar6 = this->descriptor_;
  uVar8 = extraout_RDX_03;
  if (0 < *(int *)(pDVar6 + 0x48)) {
    lVar12 = 0;
    lVar13 = 0;
    do {
      EnumGenerator::EnumGenerator
                ((EnumGenerator *)&messageGenerator,
                 (EnumDescriptor *)(*(long *)(pDVar6 + 0x50) + lVar12));
      EnumGenerator::Generate((EnumGenerator *)&messageGenerator,printer);
      EnumGenerator::~EnumGenerator((EnumGenerator *)&messageGenerator);
      lVar13 = lVar13 + 1;
      pDVar6 = this->descriptor_;
      lVar12 = lVar12 + 0x38;
      uVar8 = extraout_RDX_04;
    } while (lVar13 < *(int *)(pDVar6 + 0x48));
  }
  pDVar6 = this->descriptor_;
  if (0 < *(int *)(pDVar6 + 0x38)) {
    lVar13 = 0;
    lVar12 = 0;
    do {
      messageGenerator.descriptor_ = (Descriptor *)(*(long *)(pDVar6 + 0x40) + lVar13);
      FieldGeneratorMap::FieldGeneratorMap
                (&messageGenerator.field_generators_,messageGenerator.descriptor_);
      GenerateInterface(&messageGenerator,printer);
      Generate(&messageGenerator,printer);
      FieldGeneratorMap::~FieldGeneratorMap(&messageGenerator.field_generators_);
      lVar12 = lVar12 + 1;
      pDVar6 = this->descriptor_;
      lVar13 = lVar13 + 0x78;
      uVar8 = extraout_RDX_05;
    } while (lVar12 < *(int *)(pDVar6 + 0x38));
  }
  pDVar6 = this->descriptor_;
  if (*(int *)(pDVar6 + 0x2c) < 1) {
    iVar9 = 0;
  }
  else {
    lVar12 = 0;
    lVar13 = 0;
    iVar9 = 0;
    do {
      pFVar5 = FieldGeneratorMap::get
                         (&this->field_generators_,
                          (FieldDescriptor *)(*(long *)(pDVar6 + 0x30) + lVar12));
      iVar3 = (*pFVar5->_vptr_FieldGenerator[2])(pFVar5);
      iVar9 = iVar9 + iVar3;
      lVar13 = lVar13 + 1;
      pDVar6 = this->descriptor_;
      lVar12 = lVar12 + 0x78;
      uVar8 = extraout_RDX_06;
    } while (lVar13 < *(int *)(pDVar6 + 0x2c));
  }
  if (0 < iVar9) {
    uVar10 = iVar9 + 0x1fU >> 5;
    uVar11 = 1;
    if (1 < uVar10) {
      uVar11 = uVar10;
    }
    uVar10 = 0;
    do {
      GetBitFieldName_abi_cxx11_((string *)&messageGenerator,(java *)(ulong)uVar10,(int)uVar8);
      io::Printer::Print(printer,"private int $bit_field_name$;\n","bit_field_name",
                         (string *)&messageGenerator);
      uVar8 = extraout_RDX_07;
      if (messageGenerator.descriptor_ !=
          (Descriptor *)&messageGenerator.field_generators_.field_generators_) {
        operator_delete(messageGenerator.descriptor_,
                        (ulong)((long)&(messageGenerator.field_generators_.field_generators_.array_)
                                       ->ptr_ + 1));
        uVar8 = extraout_RDX_08;
      }
      uVar10 = uVar10 + 1;
    } while (uVar11 != uVar10);
  }
  pDVar6 = this->descriptor_;
  if (0 < *(int *)(pDVar6 + 0x2c)) {
    lVar12 = 0;
    lVar13 = 0;
    do {
      anon_unknown_5::PrintFieldComment
                (printer,(FieldDescriptor *)(*(long *)(pDVar6 + 0x30) + lVar12));
      FieldConstantName_abi_cxx11_
                ((string *)&messageGenerator,(java *)(*(long *)(this->descriptor_ + 0x30) + lVar12),
                 field);
      SimpleItoa_abi_cxx11_
                ((string *)local_1e0,
                 (protobuf *)(ulong)*(uint *)(*(long *)(this->descriptor_ + 0x30) + 0x28 + lVar12),i
                );
      io::Printer::Print(printer,"public static final int $constant_name$ = $number$;\n",
                         "constant_name",(string *)&messageGenerator,"number",(string *)local_1e0);
      if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
        operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
      }
      if (messageGenerator.descriptor_ !=
          (Descriptor *)&messageGenerator.field_generators_.field_generators_) {
        operator_delete(messageGenerator.descriptor_,
                        (ulong)((long)&(messageGenerator.field_generators_.field_generators_.array_)
                                       ->ptr_ + 1));
      }
      pFVar5 = FieldGeneratorMap::get
                         (&this->field_generators_,
                          (FieldDescriptor *)(*(long *)(this->descriptor_ + 0x30) + lVar12));
      (*pFVar5->_vptr_FieldGenerator[5])(pFVar5,printer);
      io::Printer::Print(printer,"\n");
      lVar13 = lVar13 + 1;
      pDVar6 = this->descriptor_;
      lVar12 = lVar12 + 0x78;
    } while (lVar13 < *(int *)(pDVar6 + 0x2c));
  }
  io::Printer::Print(printer,"private void initFields() {\n");
  io::Printer::Indent(printer);
  pDVar6 = this->descriptor_;
  if (0 < *(int *)(pDVar6 + 0x2c)) {
    lVar12 = 0;
    lVar13 = 0;
    do {
      pFVar5 = FieldGeneratorMap::get
                         (&this->field_generators_,
                          (FieldDescriptor *)(*(long *)(pDVar6 + 0x30) + lVar12));
      (*pFVar5->_vptr_FieldGenerator[7])(pFVar5,printer);
      lVar13 = lVar13 + 1;
      pDVar6 = this->descriptor_;
      lVar12 = lVar12 + 0x78;
    } while (lVar13 < *(int *)(pDVar6 + 0x2c));
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) != 2) {
    GenerateIsInitialized(this,printer,MEMOIZE);
    GenerateMessageSerializationMethods(this,printer);
  }
  if (*(char *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x55) == '\x01') {
    GenerateEqualsAndHashCode(this,printer);
  }
  GenerateParseFromMethods(this,printer);
  GenerateBuilder(this,printer);
  io::Printer::Print(printer,
                     "\nstatic {\n  defaultInstance = new $classname$(true);\n  defaultInstance.initFields();\n}\n\n// @@protoc_insertion_point(class_scope:$full_name$)\n"
                     ,"classname",*(string **)this->descriptor_,"full_name",
                     *(string **)(this->descriptor_ + 8));
  pDVar6 = this->descriptor_;
  if (0 < *(int *)(pDVar6 + 0x68)) {
    lVar12 = 0;
    lVar13 = 0;
    do {
      ExtensionGenerator::ExtensionGenerator
                ((ExtensionGenerator *)&messageGenerator,
                 (FieldDescriptor *)(*(long *)(pDVar6 + 0x70) + lVar12));
      ExtensionGenerator::Generate((ExtensionGenerator *)&messageGenerator,printer);
      ExtensionGenerator::~ExtensionGenerator((ExtensionGenerator *)&messageGenerator);
      lVar13 = lVar13 + 1;
      pDVar6 = this->descriptor_;
      lVar12 = lVar12 + 0x78;
    } while (lVar13 < *(int *)(pDVar6 + 0x68));
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)builder_type._M_dataplus._M_p != &builder_type.field_2) {
    operator_delete(builder_type._M_dataplus._M_p,
                    CONCAT71(builder_type.field_2._M_allocated_capacity._1_7_,
                             builder_type.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void MessageGenerator::Generate(io::Printer* printer) {
  bool is_own_file =
    descriptor_->containing_type() == NULL &&
    descriptor_->file()->options().java_multiple_files();

  WriteMessageDocComment(printer, descriptor_);

  // The builder_type stores the super type name of the nested Builder class.
  string builder_type;
  if (descriptor_->extension_range_count() > 0) {
    if (HasDescriptorMethods(descriptor_)) {
      printer->Print(
        "public $static$ final class $classname$ extends\n"
        "    com.google.protobuf.GeneratedMessage.ExtendableMessage<\n"
        "      $classname$> implements $classname$OrBuilder {\n",
        "static", is_own_file ? "" : "static",
        "classname", descriptor_->name());
      builder_type = strings::Substitute(
          "com.google.protobuf.GeneratedMessage.ExtendableBuilder<$0, ?>",
          ClassName(descriptor_));
    } else {
      printer->Print(
        "public $static$ final class $classname$ extends\n"
        "    com.google.protobuf.GeneratedMessageLite.ExtendableMessage<\n"
        "      $classname$> implements $classname$OrBuilder {\n",
        "static", is_own_file ? "" : "static",
        "classname", descriptor_->name());
      builder_type = strings::Substitute(
          "com.google.protobuf.GeneratedMessageLite.ExtendableBuilder<$0, ?>",
          ClassName(descriptor_));
    }
  } else {
    if (HasDescriptorMethods(descriptor_)) {
      printer->Print(
        "public $static$ final class $classname$ extends\n"
        "    com.google.protobuf.GeneratedMessage\n"
        "    implements $classname$OrBuilder {\n",
        "static", is_own_file ? "" : "static",
        "classname", descriptor_->name());
      builder_type = "com.google.protobuf.GeneratedMessage.Builder<?>";
    } else {
      printer->Print(
        "public $static$ final class $classname$ extends\n"
        "    com.google.protobuf.GeneratedMessageLite\n"
        "    implements $classname$OrBuilder {\n",
        "static", is_own_file ? "" : "static",
        "classname", descriptor_->name());
      builder_type = "com.google.protobuf.GeneratedMessageLite.Builder";
    }
  }
  printer->Indent();
  // Using builder_type, instead of Builder, prevents the Builder class from
  // being loaded into PermGen space when the default instance is created.
  // This optimizes the PermGen space usage for clients that do not modify
  // messages.
  printer->Print(
    "// Use $classname$.newBuilder() to construct.\n"
    "private $classname$($buildertype$ builder) {\n"
    "  super(builder);\n"
    "$set_unknown_fields$\n"
    "}\n",
    "classname", descriptor_->name(),
    "buildertype", builder_type,
    "set_unknown_fields", HasUnknownFields(descriptor_)
        ? "  this.unknownFields = builder.getUnknownFields();" : "");
  printer->Print(
    // Used when constructing the default instance, which cannot be initialized
    // immediately because it may cyclically refer to other default instances.
    "private $classname$(boolean noInit) {$set_default_unknown_fields$}\n"
    "\n"
    "private static final $classname$ defaultInstance;\n"
    "public static $classname$ getDefaultInstance() {\n"
    "  return defaultInstance;\n"
    "}\n"
    "\n"
    "public $classname$ getDefaultInstanceForType() {\n"
    "  return defaultInstance;\n"
    "}\n"
    "\n",
    "classname", descriptor_->name(),
    "set_default_unknown_fields", HasUnknownFields(descriptor_)
        ? " this.unknownFields ="
          " com.google.protobuf.UnknownFieldSet.getDefaultInstance(); " : "");

  if (HasUnknownFields(descriptor_)) {
    printer->Print(
        "private final com.google.protobuf.UnknownFieldSet unknownFields;\n"
        ""
        "@java.lang.Override\n"
        "public final com.google.protobuf.UnknownFieldSet\n"
        "    getUnknownFields() {\n"
        "  return this.unknownFields;\n"
        "}\n");
  }

  if (HasGeneratedMethods(descriptor_)) {
    GenerateParsingConstructor(printer);
  }

  GenerateDescriptorMethods(printer);
  GenerateParser(printer);

  // Nested types
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    EnumGenerator(descriptor_->enum_type(i)).Generate(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    MessageGenerator messageGenerator(descriptor_->nested_type(i));
    messageGenerator.GenerateInterface(printer);
    messageGenerator.Generate(printer);
  }

  // Integers for bit fields.
  int totalBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    totalBits += field_generators_.get(descriptor_->field(i))
        .GetNumBitsForMessage();
  }
  int totalInts = (totalBits + 31) / 32;
  for (int i = 0; i < totalInts; i++) {
    printer->Print("private int $bit_field_name$;\n",
      "bit_field_name", GetBitFieldName(i));
  }

  // Fields
  for (int i = 0; i < descriptor_->field_count(); i++) {
    PrintFieldComment(printer, descriptor_->field(i));
    printer->Print("public static final int $constant_name$ = $number$;\n",
      "constant_name", FieldConstantName(descriptor_->field(i)),
      "number", SimpleItoa(descriptor_->field(i)->number()));
    field_generators_.get(descriptor_->field(i)).GenerateMembers(printer);
    printer->Print("\n");
  }

  // Called by the constructor, except in the case of the default instance,
  // in which case this is called by static init code later on.
  printer->Print("private void initFields() {\n");
  printer->Indent();
  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
                     .GenerateInitializationCode(printer);
  }
  printer->Outdent();
  printer->Print("}\n");

  if (HasGeneratedMethods(descriptor_)) {
    GenerateIsInitialized(printer, MEMOIZE);
    GenerateMessageSerializationMethods(printer);
  }

  if (HasEqualsAndHashCode(descriptor_)) {
    GenerateEqualsAndHashCode(printer);
  }

  GenerateParseFromMethods(printer);
  GenerateBuilder(printer);

  // Carefully initialize the default instance in such a way that it doesn't
  // conflict with other initialization.
  printer->Print(
    "\n"
    "static {\n"
    "  defaultInstance = new $classname$(true);\n"
    "  defaultInstance.initFields();\n"
    "}\n"
    "\n"
    "// @@protoc_insertion_point(class_scope:$full_name$)\n",
    "classname", descriptor_->name(),
    "full_name", descriptor_->full_name());

  // Extensions must be declared after the defaultInstance is initialized
  // because the defaultInstance is used by the extension to lazily retrieve
  // the outer class's FileDescriptor.
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ExtensionGenerator(descriptor_->extension(i)).Generate(printer);
  }

  printer->Outdent();
  printer->Print("}\n\n");
}